

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execTrapcc<(moira::Core)2,(moira::Instr)173,(moira::Mode)12,1>(Moira *this,u16 opcode)

{
  uint uVar1;
  ulong uVar2;
  
  this->cp = 0;
  uVar1 = opcode & 7;
  uVar2 = (ulong)uVar1;
  if ((short)uVar1 != 4) {
    if (uVar1 == 3) {
      readI<(moira::Core)2,4>(this);
      uVar2 = (ulong)(this->cp + 8);
    }
    else {
      if (uVar1 != 2) goto LAB_002c9f6d;
      readI<(moira::Core)2,2>(this);
      uVar2 = (ulong)(this->cp + 6);
    }
  }
  (*this->_vptr_Moira[2])(this,uVar2);
LAB_002c9f6d:
  prefetch<(moira::Core)2,4ull>(this);
  return;
}

Assistant:

void
Moira::execTrapcc(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    switch (opcode & 0b111) {

        case 0b010: (void)readI<C, Word>(); break;
        case 0b011: (void)readI<C, Long>(); break;
    }

    if (cond<I>()) {

        execException<C>(M68kException::TRAPV);
        CYCLES_68020(20);
        return;
    }

    switch (opcode & 0b111) {

        case 0b100: CYCLES_68020(4); break;
        case 0b010: CYCLES_68020(6); break;
        case 0b011: CYCLES_68020(8); break;
    }

    prefetch<C, POLL>();

    FINALIZE
}